

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

matrix<double> * __thiscall mat_lib::matrix<double>::operator/=(matrix<double> *this,float scalar)

{
  size_t sVar1;
  size_t sVar2;
  element_t *peVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  size_t i;
  size_t sVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  string local_1b0 [32];
  ostringstream str_stream;
  
  if ((scalar == 0.0) && (!NAN(scalar))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str_stream);
    poVar4 = std::operator<<((ostream *)&str_stream,"divide by zero! bad scalar provided (");
    poVar4 = std::operator<<(poVar4,"operator/=");
    poVar4 = std::operator<<(poVar4,"() in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x183);
    std::operator<<(poVar4,")");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,local_1b0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar1 = this->rows__;
  sVar2 = this->columns__;
  for (sVar5 = 0; sVar5 != sVar1; sVar5 = sVar5 + 1) {
    lVar6 = sVar2 * sVar5;
    peVar3 = this->elements__;
    lVar7 = 0;
    sVar8 = sVar2;
    while (bVar9 = sVar8 != 0, sVar8 = sVar8 - 1, bVar9) {
      *(double *)((long)peVar3 + (lVar7 >> 0x1d) + lVar6 * 8) =
           *(double *)((long)peVar3 + (lVar7 >> 0x1d) + lVar6 * 8) / (double)scalar;
      lVar7 = lVar7 + 0x100000000;
    }
  }
  return this;
}

Assistant:

matrix<T>& matrix<T>::operator/=(float scalar)
  {
    if(scalar==0) 
    {
      ostringstream str_stream;
      str_stream<<"divide by zero! bad scalar provided ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw invalid_argument(str_stream.str());
    }
    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) elements__[offset__(i,j)]/=scalar;

    return *this;
  }